

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void google::protobuf::UnknownFieldSet::MergeToInternalMetdata
               (UnknownFieldSet *other,InternalMetadataWithArena *metadata)

{
  void *pvVar1;
  UnknownFieldSet *this;
  
  pvVar1 = (metadata->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    this = internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&metadata->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
  }
  else {
    this = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  MergeFrom(this,other);
  return;
}

Assistant:

void UnknownFieldSet::MergeToInternalMetdata(
    const UnknownFieldSet& other,
    internal::InternalMetadataWithArena* metadata) {
  metadata->mutable_unknown_fields()->MergeFrom(other);
}